

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd_int8.h
# Opt level: O0

void ncnn::transpose_pack_B_tile_int8(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long *plVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  undefined1 in_DIL;
  undefined7 in_register_00000039;
  int in_R8D;
  int in_R9D;
  int kk_3;
  char *p0_3;
  int kk_2;
  char *p0_2;
  __m128i _si;
  __m128i _pp_2;
  int kk_1;
  __m128i _vindex;
  char *p0_1;
  __m128i _p;
  __m128i _pp_1;
  __m128i _p1_1;
  __m128i _p0_1;
  __m256i _pp;
  __m128i _p3;
  __m128i _p2;
  __m128i _p1;
  __m128i _p0;
  int kk;
  char *p0;
  int jj;
  char *pp;
  int B_hstep;
  __m128i _tmp1;
  __m128i _tmp0;
  int local_58c;
  undefined1 *local_588;
  int local_57c;
  undefined1 *local_578;
  undefined8 local_560;
  undefined8 uStack_558;
  int local_544;
  undefined1 *local_528;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined1 local_480 [16];
  int local_46c;
  ulong *local_468;
  int local_45c;
  undefined1 (*local_458) [16];
  
  plVar5 = (long *)CONCAT71(in_register_00000039,in_DIL);
  uVar1 = *(uint *)((long)plVar5 + 0x2c);
  local_458 = (undefined1 (*) [16])*in_RSI;
  for (local_45c = 0; local_45c + 7 < in_ECX; local_45c = local_45c + 8) {
    local_468 = (ulong *)(*plVar5 + (long)*(int *)((long)plVar5 + 0x2c) * (long)in_R8D * plVar5[2] +
                         (long)(in_EDX + local_45c));
    for (local_46c = 0; local_46c + 3 < in_R9D; local_46c = local_46c + 4) {
      local_480._8_8_ = 0;
      local_480._0_8_ = *local_468;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)((long)local_468 + (long)(int)uVar1);
      auVar2 = vpunpcklbw_avx(local_480,auVar2);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(ulong *)((long)local_468 + (long)(int)(uVar1 * 2));
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *(ulong *)((long)local_468 + (long)(int)(uVar1 * 3));
      auVar3 = vpunpcklbw_avx(auVar4,auVar3);
      auVar4 = vpunpcklwd_avx(auVar2,auVar3);
      auVar2 = vpunpckhwd_avx(auVar2,auVar3);
      *local_458 = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar4;
      local_458[1] = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
      local_458 = local_458 + 2;
      local_468 = (ulong *)((long)local_468 + (long)(int)(uVar1 << 2));
    }
    for (; local_46c + 1 < in_R9D; local_46c = local_46c + 2) {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *local_468;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)((long)local_468 + (long)(int)uVar1);
      auVar2 = vpunpcklbw_avx(auVar7,auVar6);
      local_510 = auVar2._0_8_;
      uStack_508 = auVar2._8_8_;
      *(undefined8 *)*local_458 = local_510;
      *(undefined8 *)(*local_458 + 8) = uStack_508;
      local_458 = local_458 + 1;
      local_468 = (ulong *)((long)local_468 + (long)(int)(uVar1 << 1));
    }
    for (; local_46c < in_R9D; local_46c = local_46c + 1) {
      *(ulong *)*local_458 = *local_468;
      local_458 = (undefined1 (*) [16])(*local_458 + 8);
      local_468 = (ulong *)((long)local_468 + (long)(int)uVar1);
    }
  }
  for (; local_45c + 3 < in_ECX; local_45c = local_45c + 4) {
    local_528 = (undefined1 *)
                (*plVar5 + (long)*(int *)((long)plVar5 + 0x2c) * (long)in_R8D * plVar5[2] +
                (long)(in_EDX + local_45c));
    auVar2 = vpinsrd_avx(ZEXT416(0),1,1);
    auVar2 = vpinsrd_avx(auVar2,2,2);
    auVar2 = vpinsrd_avx(auVar2,3,3);
    auVar3 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
    auVar3 = vpinsrd_avx(auVar3,uVar1,2);
    auVar3 = vpinsrd_avx(auVar3,uVar1,3);
    vpmulld_avx(auVar2,auVar3);
    for (local_544 = 0; local_544 + 3 < in_R9D; local_544 = local_544 + 4) {
      auVar2 = vpinsrd_avx(ZEXT416(0xffffffff),0xffffffff,1);
      auVar2 = vpinsrd_avx(auVar2,0xffffffff,2);
      auVar2 = vpinsrd_avx(auVar2,0xffffffff,3);
      auVar3 = vpgatherdd(ZEXT816(0) << 0x40,auVar2);
      auVar2 = vpinsrb_avx(ZEXT116(0),4,1);
      auVar2 = vpinsrb_avx(auVar2,8,2);
      auVar2 = vpinsrb_avx(auVar2,0xc,3);
      auVar2 = vpinsrb_avx(auVar2,1,4);
      auVar2 = vpinsrb_avx(auVar2,5,5);
      auVar2 = vpinsrb_avx(auVar2,9,6);
      auVar2 = vpinsrb_avx(auVar2,0xd,7);
      auVar2 = vpinsrb_avx(auVar2,2,8);
      auVar2 = vpinsrb_avx(auVar2,6,9);
      auVar2 = vpinsrb_avx(auVar2,10,10);
      auVar2 = vpinsrb_avx(auVar2,0xe,0xb);
      auVar2 = vpinsrb_avx(auVar2,3,0xc);
      auVar2 = vpinsrb_avx(auVar2,7,0xd);
      auVar2 = vpinsrb_avx(auVar2,0xb,0xe);
      auVar2 = vpinsrb_avx(auVar2,0xf,0xf);
      auVar2 = vpshufb_avx(auVar3,auVar2);
      local_560 = auVar2._0_8_;
      uStack_558 = auVar2._8_8_;
      *(undefined8 *)*local_458 = local_560;
      *(undefined8 *)(*local_458 + 8) = uStack_558;
      local_458 = local_458 + 1;
      local_528 = local_528 + (int)(uVar1 << 2);
    }
    for (; local_544 + 1 < in_R9D; local_544 = local_544 + 2) {
      (*local_458)[0] = *local_528;
      (*local_458)[1] = local_528[(int)uVar1];
      (*local_458)[2] = local_528[1];
      (*local_458)[3] = local_528[(int)(uVar1 + 1)];
      (*local_458)[4] = local_528[2];
      (*local_458)[5] = local_528[(int)(uVar1 + 2)];
      (*local_458)[6] = local_528[3];
      (*local_458)[7] = local_528[(int)(uVar1 + 3)];
      local_458 = (undefined1 (*) [16])(*local_458 + 8);
      local_528 = local_528 + (int)(uVar1 << 1);
    }
    for (; local_544 < in_R9D; local_544 = local_544 + 1) {
      (*local_458)[0] = *local_528;
      (*local_458)[1] = local_528[1];
      (*local_458)[2] = local_528[2];
      (*local_458)[3] = local_528[3];
      local_458 = (undefined1 (*) [16])(*local_458 + 4);
      local_528 = local_528 + (int)uVar1;
    }
  }
  for (; local_45c + 1 < in_ECX; local_45c = local_45c + 2) {
    local_578 = (undefined1 *)
                (*plVar5 + (long)*(int *)((long)plVar5 + 0x2c) * (long)in_R8D * plVar5[2] +
                (long)(in_EDX + local_45c));
    for (local_57c = 0; local_57c + 3 < in_R9D; local_57c = local_57c + 4) {
      (*local_458)[0] = *local_578;
      (*local_458)[1] = local_578[(int)uVar1];
      (*local_458)[2] = local_578[(int)(uVar1 << 1)];
      (*local_458)[3] = local_578[(int)(uVar1 * 3)];
      (*local_458)[4] = local_578[1];
      (*local_458)[5] = local_578[(int)(uVar1 + 1)];
      (*local_458)[6] = local_578[(int)(uVar1 * 2 + 1)];
      (*local_458)[7] = local_578[(int)(uVar1 * 3 + 1)];
      local_458 = (undefined1 (*) [16])(*local_458 + 8);
      local_578 = local_578 + (int)(uVar1 << 2);
    }
    for (; local_57c + 1 < in_R9D; local_57c = local_57c + 2) {
      (*local_458)[0] = *local_578;
      (*local_458)[1] = local_578[(int)uVar1];
      (*local_458)[2] = local_578[1];
      (*local_458)[3] = local_578[(int)(uVar1 + 1)];
      local_458 = (undefined1 (*) [16])(*local_458 + 4);
      local_578 = local_578 + (int)(uVar1 << 1);
    }
    for (; local_57c < in_R9D; local_57c = local_57c + 1) {
      (*local_458)[0] = *local_578;
      (*local_458)[1] = local_578[1];
      local_458 = (undefined1 (*) [16])(*local_458 + 2);
      local_578 = local_578 + (int)uVar1;
    }
  }
  for (; local_45c < in_ECX; local_45c = local_45c + 1) {
    local_588 = (undefined1 *)
                (*plVar5 + (long)*(int *)((long)plVar5 + 0x2c) * (long)in_R8D * plVar5[2] +
                (long)(in_EDX + local_45c));
    for (local_58c = 0; local_58c + 3 < in_R9D; local_58c = local_58c + 4) {
      (*local_458)[0] = *local_588;
      (*local_458)[1] = local_588[(int)uVar1];
      (*local_458)[2] = local_588[(int)(uVar1 << 1)];
      (*local_458)[3] = local_588[(int)(uVar1 * 3)];
      local_458 = (undefined1 (*) [16])(*local_458 + 4);
      local_588 = local_588 + (int)(uVar1 << 2);
    }
    for (; local_58c < in_R9D; local_58c = local_58c + 1) {
      (*local_458)[0] = *local_588;
      local_458 = (undefined1 (*) [16])(*local_458 + 1);
      local_588 = local_588 + (int)uVar1;
    }
  }
  return;
}

Assistant:

static void transpose_pack_B_tile_int8(const Mat& B, Mat& BT, int batch, int max_jj, int max_kk, int nT)
{
    #pragma omp parallel for num_threads(nT)
    for (int b = 0; b < batch; b++)
    {
        short* pp = BT.row<short>(b);

        int jj = 0;
#if __SSE2__
#if defined(__x86_64__) || defined(_M_X64)
#if __AVX512F__
        for (; jj + 15 < max_jj; jj += 16)
        {
            const short* p0 = B;

            int kk = 0;
            p0 += (b * max_jj + jj) * 16;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512i _r0 = _mm512_loadu_si512((const __m512i*)p0);
                __m512i _r1 = _mm512_loadu_si512((const __m512i*)(p0 + 32));
                __m512i _r2 = _mm512_loadu_si512((const __m512i*)(p0 + 64));
                __m512i _r3 = _mm512_loadu_si512((const __m512i*)(p0 + 96));
                __m512i _r4 = _mm512_loadu_si512((const __m512i*)(p0 + 128));
                __m512i _r5 = _mm512_loadu_si512((const __m512i*)(p0 + 160));
                __m512i _r6 = _mm512_loadu_si512((const __m512i*)(p0 + 192));
                __m512i _r7 = _mm512_loadu_si512((const __m512i*)(p0 + 224));
                __m512i _tmp0 = _mm512_shuffle_i32x4(_r0, _r2, _MM_SHUFFLE(1, 0, 1, 0));
                __m512i _tmp1 = _mm512_shuffle_i32x4(_r0, _r2, _MM_SHUFFLE(3, 2, 3, 2));
                __m512i _tmp2 = _mm512_shuffle_i32x4(_r1, _r3, _MM_SHUFFLE(1, 0, 1, 0));
                __m512i _tmp3 = _mm512_shuffle_i32x4(_r1, _r3, _MM_SHUFFLE(3, 2, 3, 2));
                __m512i _tmp4 = _mm512_shuffle_i32x4(_r4, _r6, _MM_SHUFFLE(1, 0, 1, 0));
                __m512i _tmp5 = _mm512_shuffle_i32x4(_r4, _r6, _MM_SHUFFLE(3, 2, 3, 2));
                __m512i _tmp6 = _mm512_shuffle_i32x4(_r5, _r7, _MM_SHUFFLE(1, 0, 1, 0));
                __m512i _tmp7 = _mm512_shuffle_i32x4(_r5, _r7, _MM_SHUFFLE(3, 2, 3, 2));
                _r0 = _mm512_unpacklo_epi32(_tmp0, _tmp1);
                _r1 = _mm512_unpackhi_epi32(_tmp0, _tmp1);
                _r2 = _mm512_unpacklo_epi32(_tmp2, _tmp3);
                _r3 = _mm512_unpackhi_epi32(_tmp2, _tmp3);
                _r4 = _mm512_unpacklo_epi32(_tmp4, _tmp5);
                _r5 = _mm512_unpackhi_epi32(_tmp4, _tmp5);
                _r6 = _mm512_unpacklo_epi32(_tmp6, _tmp7);
                _r7 = _mm512_unpackhi_epi32(_tmp6, _tmp7);
                _tmp0 = _mm512_unpacklo_epi64(_r0, _r2);
                _tmp1 = _mm512_unpackhi_epi64(_r0, _r2);
                _tmp2 = _mm512_unpacklo_epi64(_r1, _r3);
                _tmp3 = _mm512_unpackhi_epi64(_r1, _r3);
                _tmp4 = _mm512_unpacklo_epi64(_r4, _r6);
                _tmp5 = _mm512_unpackhi_epi64(_r4, _r6);
                _tmp6 = _mm512_unpacklo_epi64(_r5, _r7);
                _tmp7 = _mm512_unpackhi_epi64(_r5, _r7);
                _r0 = _mm512_shuffle_i32x4(_tmp0, _tmp4, _MM_SHUFFLE(2, 0, 2, 0));
                _r1 = _mm512_shuffle_i32x4(_tmp1, _tmp5, _MM_SHUFFLE(2, 0, 2, 0));
                _r2 = _mm512_shuffle_i32x4(_tmp2, _tmp6, _MM_SHUFFLE(2, 0, 2, 0));
                _r3 = _mm512_shuffle_i32x4(_tmp3, _tmp7, _MM_SHUFFLE(2, 0, 2, 0));
                _r4 = _mm512_shuffle_i32x4(_tmp0, _tmp4, _MM_SHUFFLE(3, 1, 3, 1));
                _r5 = _mm512_shuffle_i32x4(_tmp1, _tmp5, _MM_SHUFFLE(3, 1, 3, 1));
                _r6 = _mm512_shuffle_i32x4(_tmp2, _tmp6, _MM_SHUFFLE(3, 1, 3, 1));
                _r7 = _mm512_shuffle_i32x4(_tmp3, _tmp7, _MM_SHUFFLE(3, 1, 3, 1));
                _mm512_storeu_si512((__m512i*)pp, _r0);
                _mm512_storeu_si512((__m512i*)(pp + 32), _r1);
                _mm512_storeu_si512((__m512i*)(pp + 64), _r2);
                _mm512_storeu_si512((__m512i*)(pp + 96), _r3);
                _mm512_storeu_si512((__m512i*)(pp + 128), _r4);
                _mm512_storeu_si512((__m512i*)(pp + 160), _r5);
                _mm512_storeu_si512((__m512i*)(pp + 192), _r6);
                _mm512_storeu_si512((__m512i*)(pp + 224), _r7);
                p0 += max_jj * batch * 16;
                pp += 256;
            }
            p0 -= (b * max_jj + jj) * 16;
            p0 += (b * max_jj + jj) * 8;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m512i _r0 = _mm512_loadu_si512((const __m512i*)p0);
                __m512i _r1 = _mm512_loadu_si512((const __m512i*)(p0 + 32));
                __m512i _r2 = _mm512_loadu_si512((const __m512i*)(p0 + 64));
                __m512i _r3 = _mm512_loadu_si512((const __m512i*)(p0 + 96));
                __m512i _tmp0 = _mm512_shuffle_i32x4(_r0, _r1, _MM_SHUFFLE(2, 0, 2, 0));
                __m512i _tmp1 = _mm512_shuffle_i32x4(_r0, _r1, _MM_SHUFFLE(3, 1, 3, 1));
                __m512i _tmp2 = _mm512_shuffle_i32x4(_r2, _r3, _MM_SHUFFLE(2, 0, 2, 0));
                __m512i _tmp3 = _mm512_shuffle_i32x4(_r2, _r3, _MM_SHUFFLE(3, 1, 3, 1));
                _r0 = _mm512_unpacklo_epi32(_tmp0, _tmp1);
                _r1 = _mm512_unpackhi_epi32(_tmp0, _tmp1);
                _r2 = _mm512_unpacklo_epi32(_tmp2, _tmp3);
                _r3 = _mm512_unpackhi_epi32(_tmp2, _tmp3);
                _tmp0 = _mm512_permutex_epi64(_r0, _MM_SHUFFLE(3, 1, 2, 0));
                _tmp1 = _mm512_permutex_epi64(_r1, _MM_SHUFFLE(3, 1, 2, 0));
                _tmp2 = _mm512_permutex_epi64(_r2, _MM_SHUFFLE(3, 1, 2, 0));
                _tmp3 = _mm512_permutex_epi64(_r3, _MM_SHUFFLE(3, 1, 2, 0));
                _r0 = _mm512_shuffle_i32x4(_tmp0, _tmp2, _MM_SHUFFLE(2, 0, 2, 0));
                _r1 = _mm512_shuffle_i32x4(_tmp0, _tmp2, _MM_SHUFFLE(3, 1, 3, 1));
                _r2 = _mm512_shuffle_i32x4(_tmp1, _tmp3, _MM_SHUFFLE(2, 0, 2, 0));
                _r3 = _mm512_shuffle_i32x4(_tmp1, _tmp3, _MM_SHUFFLE(3, 1, 3, 1));
                _mm512_storeu_si512((__m512i*)pp, _r0);
                _mm512_storeu_si512((__m512i*)(pp + 32), _r1);
                _mm512_storeu_si512((__m512i*)(pp + 64), _r2);
                _mm512_storeu_si512((__m512i*)(pp + 96), _r3);
                p0 += max_jj * batch * 8;
                pp += 128;
            }
            p0 -= (b * max_jj + jj) * 8;
            p0 += (b * max_jj + jj) * 2;
            for (; kk + 1 < max_kk; kk += 2)
            {
                __m512i _r0 = _mm512_loadu_si512((const __m512i*)p0);
                _mm512_storeu_si512((__m512i*)pp, _r0);
                p0 += max_jj * batch * 2;
                pp += 32;
            }
            p0 -= (b * max_jj + jj) * 2;
            p0 += (b * max_jj + jj);
            for (; kk < max_kk; kk++)
            {
                __m256i _r0 = _mm256_loadu_si256((const __m256i*)p0);
                _mm256_store_si256((__m256i*)pp, _r0);
                p0 += max_jj * batch;
                pp += 16;
            }
        }
#endif // __AVX512F__
        for (; jj + 7 < max_jj; jj += 8)
        {
            const short* p0 = B;

            int kk = 0;
#if __AVX512F__
            p0 += (b * max_jj + jj) * 16;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512i _r0 = _mm512_loadu_si512((const __m512i*)p0);
                __m512i _r1 = _mm512_loadu_si512((const __m512i*)(p0 + 32));
                __m512i _r2 = _mm512_loadu_si512((const __m512i*)(p0 + 64));
                __m512i _r3 = _mm512_loadu_si512((const __m512i*)(p0 + 96));
                __m512i _tmp0 = _mm512_shuffle_i32x4(_r0, _r2, _MM_SHUFFLE(1, 0, 1, 0));
                __m512i _tmp1 = _mm512_shuffle_i32x4(_r0, _r2, _MM_SHUFFLE(3, 2, 3, 2));
                __m512i _tmp2 = _mm512_shuffle_i32x4(_r1, _r3, _MM_SHUFFLE(1, 0, 1, 0));
                __m512i _tmp3 = _mm512_shuffle_i32x4(_r1, _r3, _MM_SHUFFLE(3, 2, 3, 2));
                _r0 = _mm512_unpacklo_epi32(_tmp0, _tmp1);
                _r1 = _mm512_unpackhi_epi32(_tmp0, _tmp1);
                _r2 = _mm512_unpacklo_epi32(_tmp2, _tmp3);
                _r3 = _mm512_unpackhi_epi32(_tmp2, _tmp3);
                _tmp0 = _mm512_unpacklo_epi64(_r0, _r2);
                _tmp1 = _mm512_unpackhi_epi64(_r0, _r2);
                _tmp2 = _mm512_unpacklo_epi64(_r1, _r3);
                _tmp3 = _mm512_unpackhi_epi64(_r1, _r3);
                _r0 = _mm512_shuffle_i32x4(_tmp0, _tmp1, _MM_SHUFFLE(2, 0, 2, 0));
                _r1 = _mm512_shuffle_i32x4(_tmp2, _tmp3, _MM_SHUFFLE(2, 0, 2, 0));
                _r2 = _mm512_shuffle_i32x4(_tmp0, _tmp1, _MM_SHUFFLE(3, 1, 3, 1));
                _r3 = _mm512_shuffle_i32x4(_tmp2, _tmp3, _MM_SHUFFLE(3, 1, 3, 1));
                _mm512_storeu_si512((__m512i*)pp, _r0);
                _mm512_storeu_si512((__m512i*)(pp + 32), _r1);
                _mm512_storeu_si512((__m512i*)(pp + 64), _r2);
                _mm512_storeu_si512((__m512i*)(pp + 96), _r3);
                p0 += max_jj * batch * 16;
                pp += 128;
            }
            p0 -= (b * max_jj + jj) * 16;
#endif // __AVX512F__
            p0 += (b * max_jj + jj) * 8;
            for (; kk + 7 < max_kk; kk += 8)
            {
#if __AVX__
                __m256 _r0 = _mm256_loadu_ps((const float*)p0);
                __m256 _r1 = _mm256_loadu_ps((const float*)(p0 + 16));
                __m256 _r2 = _mm256_loadu_ps((const float*)(p0 + 32));
                __m256 _r3 = _mm256_loadu_ps((const float*)(p0 + 48));
                __m256 _tmp0 = _mm256_permute2f128_ps(_r0, _r2, _MM_SHUFFLE(0, 2, 0, 0));
                __m256 _tmp1 = _mm256_permute2f128_ps(_r0, _r2, _MM_SHUFFLE(0, 3, 0, 1));
                __m256 _tmp2 = _mm256_permute2f128_ps(_r1, _r3, _MM_SHUFFLE(0, 2, 0, 0));
                __m256 _tmp3 = _mm256_permute2f128_ps(_r1, _r3, _MM_SHUFFLE(0, 3, 0, 1));
                _r0 = _mm256_unpacklo_ps(_tmp0, _tmp1);
                _r1 = _mm256_unpackhi_ps(_tmp0, _tmp1);
                _r2 = _mm256_unpacklo_ps(_tmp2, _tmp3);
                _r3 = _mm256_unpackhi_ps(_tmp2, _tmp3);
                _tmp0 = _mm256_castpd_ps(_mm256_unpacklo_pd(_mm256_castps_pd(_r0), _mm256_castps_pd(_r2)));
                _tmp1 = _mm256_castpd_ps(_mm256_unpackhi_pd(_mm256_castps_pd(_r0), _mm256_castps_pd(_r2)));
                _tmp2 = _mm256_castpd_ps(_mm256_unpacklo_pd(_mm256_castps_pd(_r1), _mm256_castps_pd(_r3)));
                _tmp3 = _mm256_castpd_ps(_mm256_unpackhi_pd(_mm256_castps_pd(_r1), _mm256_castps_pd(_r3)));
                _mm256_storeu_ps((float*)pp, _tmp0);
                _mm256_storeu_ps((float*)(pp + 16), _tmp1);
                _mm256_storeu_ps((float*)(pp + 32), _tmp2);
                _mm256_storeu_ps((float*)(pp + 48), _tmp3);
#else
                __m128i _r0 = _mm_load_si128((const __m128i*)p0);
                __m128i _r1 = _mm_load_si128((const __m128i*)(p0 + 8));
                __m128i _r2 = _mm_load_si128((const __m128i*)(p0 + 8 * 2));
                __m128i _r3 = _mm_load_si128((const __m128i*)(p0 + 8 * 3));
                __m128i _r4 = _mm_load_si128((const __m128i*)(p0 + 8 * 4));
                __m128i _r5 = _mm_load_si128((const __m128i*)(p0 + 8 * 5));
                __m128i _r6 = _mm_load_si128((const __m128i*)(p0 + 8 * 6));
                __m128i _r7 = _mm_load_si128((const __m128i*)(p0 + 8 * 7));
                transpose4x8_epi32(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm_store_si128((__m128i*)pp, _r0);
                _mm_store_si128((__m128i*)(pp + 8), _r1);
                _mm_store_si128((__m128i*)(pp + 8 * 2), _r2);
                _mm_store_si128((__m128i*)(pp + 8 * 3), _r3);
                _mm_store_si128((__m128i*)(pp + 8 * 4), _r4);
                _mm_store_si128((__m128i*)(pp + 8 * 5), _r5);
                _mm_store_si128((__m128i*)(pp + 8 * 6), _r6);
                _mm_store_si128((__m128i*)(pp + 8 * 7), _r7);
#endif // __AVX__
                p0 += max_jj * batch * 8;
                pp += 64;
            }
            p0 -= (b * max_jj + jj) * 8;
            p0 += (b * max_jj + jj) * 2;
            for (; kk + 1 < max_kk; kk += 2)
            {
#if __AVX__
                __m256 _r0 = _mm256_loadu_ps((const float*)p0);
                _mm256_storeu_ps((float*)pp, _r0);
#else
                __m128i _r0 = _mm_loadu_si128((const __m128i*)p0);
                __m128i _r1 = _mm_loadu_si128((const __m128i*)(p0 + 8));
                _mm_store_si128((__m128i*)pp, _r0);
                _mm_store_si128((__m128i*)(pp + 8), _r1);
#endif // __AVX__
                p0 += max_jj * batch * 2;
                pp += 16;
            }
            p0 -= (b * max_jj + jj) * 2;
            p0 += (b * max_jj + jj);
            for (; kk < max_kk; kk++)
            {
                __m128i _r0 = _mm_loadu_si128((const __m128i*)p0);
                _mm_store_si128((__m128i*)pp, _r0);
                p0 += max_jj * batch;
                pp += 8;
            }
        }
#endif // defined(__x86_64__) || defined(_M_X64)
        for (; jj + 3 < max_jj; jj += 4)
        {
            const short* p0 = B;

            int kk = 0;
#if __AVX512F__
            p0 += (b * max_jj + jj) * 16;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512i _r0 = _mm512_loadu_si512((const __m512i*)p0);
                __m512i _r1 = _mm512_loadu_si512((const __m512i*)(p0 + 32));
                __m512i _tmp0 = _mm512_shuffle_i32x4(_r0, _r1, _MM_SHUFFLE(1, 0, 1, 0));
                __m512i _tmp1 = _mm512_shuffle_i32x4(_r0, _r1, _MM_SHUFFLE(3, 2, 3, 2));
                _r0 = _mm512_unpacklo_epi32(_tmp0, _tmp1);
                _r1 = _mm512_unpackhi_epi32(_tmp0, _tmp1);
                _r0 = _mm512_permutex_epi64(_r0, _MM_SHUFFLE(3, 1, 2, 0));
                _r1 = _mm512_permutex_epi64(_r1, _MM_SHUFFLE(3, 1, 2, 0));
                _tmp0 = _mm512_shuffle_i32x4(_r0, _r1, _MM_SHUFFLE(1, 0, 1, 0));
                _tmp1 = _mm512_shuffle_i32x4(_r0, _r1, _MM_SHUFFLE(3, 2, 3, 2));
                _r0 = _mm512_unpacklo_epi64(_tmp0, _tmp1);
                _r1 = _mm512_unpackhi_epi64(_tmp0, _tmp1);
                _mm512_storeu_si512((__m512i*)pp, _r0);
                _mm512_storeu_si512((__m512i*)(pp + 32), _r1);
                p0 += max_jj * batch * 16;
                pp += 64;
            }
            p0 -= (b * max_jj + jj) * 16;
#endif // __AVX512F__
            p0 += (b * max_jj + jj) * 8;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m128i _r0 = _mm_load_si128((const __m128i*)p0);
                __m128i _r1 = _mm_load_si128((const __m128i*)(p0 + 8));
                __m128i _r2 = _mm_load_si128((const __m128i*)(p0 + 8 * 2));
                __m128i _r3 = _mm_load_si128((const __m128i*)(p0 + 8 * 3));
                transpose4x4_epi32(_r0, _r1, _r2, _r3);
                _mm_storeu_si128((__m128i*)pp, _r0);
                _mm_storeu_si128((__m128i*)(pp + 8), _r1);
                _mm_storeu_si128((__m128i*)(pp + 8 * 2), _r2);
                _mm_storeu_si128((__m128i*)(pp + 8 * 3), _r3);
                p0 += max_jj * batch * 8;
                pp += 32;
            }
            p0 -= (b * max_jj + jj) * 8;
            p0 += (b * max_jj + jj) * 2;
            for (; kk + 1 < max_kk; kk += 2)
            {
                __m128i _r0 = _mm_loadu_si128((const __m128i*)p0);
                _mm_storeu_si128((__m128i*)pp, _r0);
                p0 += max_jj * batch * 2;
                pp += 8;
            }
            p0 -= (b * max_jj + jj) * 2;
            p0 += (b * max_jj + jj);
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                pp[2] = p0[2];
                pp[3] = p0[3];
                p0 += max_jj * batch;
                pp += 4;
            }
        }
#endif // __SSE2__
        for (; jj + 1 < max_jj; jj += 2)
        {
            const short* p0 = B;

            int kk = 0;
#if __SSE2__
#if __AVX512F__
            p0 += (b * max_jj + jj) * 16;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m256i _r0 = _mm256_load_si256((const __m256i*)p0);
                __m256i _r1 = _mm256_load_si256((const __m256i*)(p0 + 16));
                transpose8x2_epi32(_r0, _r1);
                _mm256_storeu_si256((__m256i*)pp, _r0);
                _mm256_storeu_si256((__m256i*)(pp + 16), _r1);
                p0 += max_jj * batch * 16;
                pp += 32;
            }
            p0 -= (b * max_jj + jj) * 16;
#endif // __AVX512F__
            p0 += (b * max_jj + jj) * 8;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m128i _r0 = _mm_load_si128((const __m128i*)p0);
                __m128i _r1 = _mm_load_si128((const __m128i*)(p0 + 8));
                __m128i _tmp0 = _mm_unpacklo_epi32(_r0, _r1);
                __m128i _tmp1 = _mm_unpackhi_epi32(_r0, _r1);
                _mm_storeu_si128((__m128i*)pp, _tmp0);
                _mm_storeu_si128((__m128i*)(pp + 8), _tmp1);
                p0 += max_jj * batch * 8;
                pp += 16;
            }
            p0 -= (b * max_jj + jj) * 8;
#endif // __SSE2__
            p0 += (b * max_jj + jj) * 2;
            for (; kk + 1 < max_kk; kk += 2)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                pp[2] = p0[2];
                pp[3] = p0[3];
                p0 += max_jj * batch * 2;
                pp += 4;
            }
            p0 -= (b * max_jj + jj) * 2;
            p0 += (b * max_jj + jj);
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                p0 += max_jj * batch;
                pp += 2;
            }
        }
        for (; jj < max_jj; jj++)
        {
            const short* p0 = B;

            int kk = 0;
#if __SSE2__
#if __AVX512F__
            p0 += (b * max_jj + jj) * 16;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m256i _r0 = _mm256_load_si256((const __m256i*)p0);
                _mm256_storeu_si256((__m256i*)pp, _r0);
                p0 += max_jj * batch * 16;
                pp += 16;
            }
            p0 -= (b * max_jj + jj) * 16;
#endif // __AVX512F__
            p0 += (b * max_jj + jj) * 8;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m128i _r0 = _mm_load_si128((const __m128i*)p0);
                _mm_storeu_si128((__m128i*)pp, _r0);
                p0 += max_jj * batch * 8;
                pp += 8;
            }
            p0 -= (b * max_jj + jj) * 8;
#endif // __SSE2__
            p0 += (b * max_jj + jj) * 2;
            for (; kk + 1 < max_kk; kk += 2)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                p0 += max_jj * batch * 2;
                pp += 2;
            }
            p0 -= (b * max_jj + jj) * 2;
            p0 += (b * max_jj + jj);
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                p0 += max_jj * batch;
                pp += 1;
            }
        }
    }
}